

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t *psVar1;
  uint uVar2;
  size_t __n;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  LRUHandle *pLVar7;
  LRUHandle **ppLVar8;
  ulong uVar9;
  LRUHandle *pLVar10;
  Mutex *__mutex;
  LRUCache *this_00;
  
  uVar3 = Hash(key->data_,key->size_,0);
  uVar4 = uVar3 >> 0x1c;
  __mutex = &this->shard_[uVar4].mutex_;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  this_00 = this->shard_ + uVar4;
  __n = key->size_;
  pLVar7 = (LRUHandle *)malloc(__n + 0x47);
  pLVar7->value = value;
  pLVar7->deleter = deleter;
  pLVar7->charge = charge;
  pLVar7->key_length = __n;
  pLVar7->hash = uVar3;
  pLVar7->in_cache = false;
  pLVar7->refs = 1;
  memcpy(pLVar7->key_data,key->data_,__n);
  if (this_00->capacity_ == 0) {
    pLVar7->next = (LRUHandle *)0x0;
    uVar9 = 0;
  }
  else {
    pLVar7->refs = 2;
    pLVar7->in_cache = true;
    pLVar7->next = &this->shard_[uVar4].in_use_;
    pLVar10 = this->shard_[uVar4].in_use_.prev;
    pLVar7->prev = pLVar10;
    pLVar10->next = pLVar7;
    this->shard_[uVar4].in_use_.prev = pLVar7;
    psVar1 = &this->shard_[uVar4].usage_;
    *psVar1 = *psVar1 + charge;
    uVar2 = this->shard_[uVar4].table_.length_;
    ppLVar8 = HandleTable::FindPointer
                        ((HandleTable *)(ulong)uVar2,(Slice *)this->shard_[uVar4].table_.list_,
                         (uint32_t)pLVar7->key_data);
    pLVar10 = *ppLVar8;
    if (pLVar10 == (LRUHandle *)0x0) {
      pLVar7->next_hash = (LRUHandle *)0x0;
      *ppLVar8 = pLVar7;
      uVar6 = this->shard_[uVar4].table_.elems_ + 1;
      this->shard_[uVar4].table_.elems_ = uVar6;
      if (uVar2 < uVar6) {
        HandleTable::Resize(&this->shard_[uVar4].table_);
      }
    }
    else {
      pLVar7->next_hash = pLVar10->next_hash;
      *ppLVar8 = pLVar7;
    }
    LRUCache::FinishErase(this_00,pLVar10);
    uVar9 = this_00->capacity_;
  }
  if (uVar9 < this->shard_[uVar4].usage_) {
    do {
      pLVar10 = this->shard_[uVar4].lru_.next;
      if (pLVar10 == &this->shard_[uVar4].lru_) break;
      pLVar10 = HandleTable::Remove(&this->shard_[uVar4].table_,(Slice *)pLVar10->key_data,
                                    (uint32_t)pLVar10->key_length);
      LRUCache::FinishErase(this_00,pLVar10);
    } while (this_00->capacity_ < this->shard_[uVar4].usage_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return (Handle *)pLVar7;
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }